

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<double,_QVariant>_>::erase
          (QMovableArrayOps<std::pair<double,_QVariant>_> *this,pair<double,_QVariant> *b,
          qsizetype n)

{
  pair<double,_QVariant> *__src;
  pair<double,_QVariant> *ppVar1;
  pair<double,_QVariant> *ppVar2;
  long lVar3;
  QVariant *this_00;
  
  __src = b + n;
  if (n != 0) {
    lVar3 = n * 0x28;
    this_00 = &b->second;
    do {
      ::QVariant::~QVariant(this_00);
      this_00 = (QVariant *)((long)(this_00 + 1) + 8);
      lVar3 = lVar3 + -0x28;
    } while (lVar3 != 0);
  }
  ppVar2 = (this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
           super_QArrayDataPointer<std::pair<double,_QVariant>_>.ptr;
  lVar3 = (this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
          super_QArrayDataPointer<std::pair<double,_QVariant>_>.size;
  ppVar1 = ppVar2 + lVar3;
  if (__src == ppVar1 || ppVar2 != b) {
    if (__src != ppVar1) {
      memmove(b,__src,(long)ppVar1 - (long)__src);
      lVar3 = (this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
              super_QArrayDataPointer<std::pair<double,_QVariant>_>.size;
    }
  }
  else {
    (this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
    super_QArrayDataPointer<std::pair<double,_QVariant>_>.ptr = __src;
  }
  (this->super_QGenericArrayOps<std::pair<double,_QVariant>_>).
  super_QArrayDataPointer<std::pair<double,_QVariant>_>.size = lVar3 - n;
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;

        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.

        std::destroy(b, e);
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else if (e != this->end()) {
            memmove(static_cast<void *>(b), static_cast<const void *>(e), (static_cast<const T *>(this->end()) - e)*sizeof(T));
        }
        this->size -= n;
    }